

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

bool __thiscall
glslang::TReflection::addStage(TReflection *this,EShLanguage stage,TIntermediate *intermediate)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int dim;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  long *plVar6;
  TIntermNode **sequnence;
  undefined8 *puVar7;
  TIntermNode **sequnence_1;
  undefined8 *puVar8;
  TReflectionTraverser it;
  undefined **local_b0;
  undefined1 local_a8;
  undefined7 local_a7;
  undefined4 uStack_a0;
  TPoolAllocator *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  TIntermediate *local_78;
  TReflection *local_70;
  _Rb_tree<const_TIntermNode_*,_const_TIntermNode_*,_std::_Identity<const_TIntermNode_*>,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
  local_68;
  undefined1 local_38;
  
  dim._0_1_ = false;
  dim._0_1_ = false;
  if ((intermediate->treeRoot != (TIntermNode *)0x0) &&
     (dim._0_1_ = dim._0_1_, intermediate->numEntryPoints == 1)) {
    if (intermediate->recursive == false) {
      if (stage == EShLangCompute) {
        lVar5 = 0;
        do {
          this->localSize[lVar5] = intermediate->localSize[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
      }
      p_Var1 = &local_68._M_impl.super__Rb_tree_header;
      local_b0 = &PTR__TIntermTraverser_0093ba08;
      local_a8 = 1;
      local_98 = (TPoolAllocator *)0x0;
      uStack_90 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_a7 = 0;
      uStack_a0 = 0;
      local_98 = GetThreadPoolAllocator();
      uStack_90 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_b0 = &PTR__TReflectionTraverser_0093bd68;
      local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_38 = 1;
      local_78 = intermediate;
      local_70 = this;
      local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      iVar4 = (*intermediate->treeRoot->_vptr_TIntermNode[6])();
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 400))
                        ((long *)CONCAT44(extraout_var,iVar4));
      puVar2 = *(undefined8 **)(lVar5 + 0x10);
      for (puVar7 = *(undefined8 **)(lVar5 + 8); puVar7 != puVar2; puVar7 = puVar7 + 1) {
        lVar5 = (**(code **)(*(long *)*puVar7 + 0x30))();
        if (lVar5 != 0) {
          lVar5 = (**(code **)(*(long *)*puVar7 + 0x30))();
          if (*(int *)(lVar5 + 0xb8) == 3) {
            local_38 = 0;
            plVar6 = (long *)(**(code **)(*(long *)*puVar7 + 0x30))();
            lVar5 = (**(code **)(*plVar6 + 400))(plVar6);
            puVar3 = *(undefined8 **)(lVar5 + 0x10);
            for (puVar8 = *(undefined8 **)(lVar5 + 8); puVar8 != puVar3; puVar8 = puVar8 + 1) {
              plVar6 = (long *)(**(code **)(*(long *)*puVar8 + 0x60))();
              if (plVar6 != (long *)0x0) {
                lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6);
                if ((((*(uint *)(lVar5 + 8) & 0x7f) == 5) &&
                    ((this->options & EShReflectionSharedStd140UBO) != EShReflectionDefault)) ||
                   ((lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6),
                    (*(uint *)(lVar5 + 8) & 0x7f) == 6 &&
                    ((this->options & EShReflectionSharedStd140SSBO) != EShReflectionDefault)))) {
                  iVar4 = (**(code **)(*plVar6 + 0x100))(plVar6);
                  if ((iVar4 == 0x10) &&
                     ((lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6),
                      (*(byte *)(lVar5 + 0x10) & 0xf) == 2 ||
                      (lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6),
                      (*(byte *)(lVar5 + 0x10) & 0xf) == 1)))) goto LAB_00375ee1;
                }
                else if ((this->options & EShReflectionAllIOVariables) != EShReflectionDefault) {
                  lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6);
                  if ((0x1b < (*(uint *)(lVar5 + 8) & 0x7f)) ||
                     ((0xe300008U >> (*(uint *)(lVar5 + 8) & 0x1f) & 1) == 0)) {
                    lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6);
                    if ((0x1e < (*(uint *)(lVar5 + 8) & 0x7f)) ||
                       ((0x71c00010U >> (*(uint *)(lVar5 + 8) & 0x1f) & 1) == 0)) goto LAB_00375ef0;
                  }
LAB_00375ee1:
                  (**(code **)(*plVar6 + 0x10))(plVar6,&local_b0);
                }
              }
LAB_00375ef0:
            }
          }
          else {
            local_38 = 1;
            plVar6 = (long *)(**(code **)(*(long *)*puVar7 + 0x30))();
            (**(code **)(*plVar6 + 0x10))(plVar6,&local_b0);
          }
        }
      }
      local_38 = 1;
      buildCounterIndices(this,intermediate);
      buildUniformStageMask(this,intermediate);
      local_b0 = &PTR__TReflectionTraverser_0093bd68;
      std::
      _Rb_tree<const_TIntermNode_*,_const_TIntermNode_*,_std::_Identity<const_TIntermNode_*>,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
      ::_M_erase(&local_68,(_Link_type)local_68._M_impl.super__Rb_tree_header._M_header._M_parent);
      dim._0_1_ = true;
    }
    else {
      dim._0_1_ = false;
    }
  }
  return dim._0_1_;
}

Assistant:

bool TReflection::addStage(EShLanguage stage, const TIntermediate& intermediate)
{
    if (intermediate.getTreeRoot() == nullptr ||
        intermediate.getNumEntryPoints() != 1 ||
        intermediate.isRecursive())
        return false;

    buildAttributeReflection(stage, intermediate);

    TReflectionTraverser it(intermediate, *this);

    for (auto& sequnence : intermediate.getTreeRoot()->getAsAggregate()->getSequence()) {
        if (sequnence->getAsAggregate() != nullptr) {
            if (sequnence->getAsAggregate()->getOp() == glslang::EOpLinkerObjects) {
                it.updateStageMasks = false;
                TIntermAggregate* linkerObjects = sequnence->getAsAggregate();
                for (auto& sequnence : linkerObjects->getSequence()) {
                    auto pNode = sequnence->getAsSymbolNode();
                    if (pNode != nullptr) {
                        if ((pNode->getQualifier().storage == EvqUniform &&
                            (options & EShReflectionSharedStd140UBO)) ||
                           (pNode->getQualifier().storage == EvqBuffer &&
                            (options & EShReflectionSharedStd140SSBO))) {
                            // collect std140 and shared uniform block form AST
                            if ((pNode->getBasicType() == EbtBlock) &&
                                ((pNode->getQualifier().layoutPacking == ElpStd140) ||
                                 (pNode->getQualifier().layoutPacking == ElpShared))) {
                                   pNode->traverse(&it);
                            }
                        }
                        else if ((options & EShReflectionAllIOVariables) &&
                            (pNode->getQualifier().isPipeInput() || pNode->getQualifier().isPipeOutput()))
                        {
                            pNode->traverse(&it);
                        }
                    }
                }
            } else {
                // This traverser will travers all function in AST.
                // If we want reflect uncalled function, we need set linke message EShMsgKeepUncalled.
                // When EShMsgKeepUncalled been set to true, all function will be keep in AST, even it is a uncalled function.
                // This will keep some uniform variables in reflection, if those uniform variables is used in these uncalled function.
                //
                // If we just want reflect only live node, we can use a default link message or set EShMsgKeepUncalled false.
                // When linke message not been set EShMsgKeepUncalled, linker won't keep uncalled function in AST.
                // So, travers all function node can equivalent to travers live function.
                it.updateStageMasks = true;
                sequnence->getAsAggregate()->traverse(&it);
            }
        }
    }
    it.updateStageMasks = true;

    buildCounterIndices(intermediate);
    buildUniformStageMask(intermediate);

    return true;
}